

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffirow(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  long lVar1;
  long lVar2;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int unaff_retaddr;
  long nblock;
  LONGLONG freespace;
  LONGLONG nbytes;
  LONGLONG nshift;
  LONGLONG firstbyte;
  LONGLONG datasize;
  LONGLONG naxis2;
  LONGLONG naxis1;
  int tstatus;
  int *in_stack_00000078;
  char *in_stack_00000080;
  LONGLONG in_stack_00000088;
  int *in_stack_00000090;
  fitsfile *in_stack_00000098;
  int *in_stack_000016b0;
  int in_stack_000016bc;
  long in_stack_000016c0;
  fitsfile *in_stack_000016c8;
  int *in_stack_00018648;
  LONGLONG in_stack_00018650;
  LONGLONG in_stack_00018658;
  LONGLONG in_stack_00018660;
  fitsfile *in_stack_00018668;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (*in_RCX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar3 = ffrdef(in_stack_00000098,in_stack_00000090), 0 < iVar3)) {
        return *in_RCX;
      }
    }
    else {
      ffmahd((fitsfile *)nblock,unaff_retaddr,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffpmsg((char *)0x11ce3c);
      *in_RCX = 0xeb;
      iVar3 = 0xeb;
    }
    else if (in_RDX < 0) {
      *in_RCX = 0x132;
      iVar3 = 0x132;
    }
    else if (in_RDX == 0) {
      iVar3 = *in_RCX;
    }
    else if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < in_RSI) {
      ffpmsg((char *)0x11ced0);
      *in_RCX = 0x133;
      iVar3 = 0x133;
    }
    else if (in_RSI < 0) {
      ffpmsg((char *)0x11cefc);
      *in_RCX = 0x133;
      iVar3 = 0x133;
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x3d8) + *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
      lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3c8) * in_RDX;
      if ((((lVar1 + 0xb3f) / 0xb40) * 0xb40 - lVar1) - lVar2 < 0) {
        ffiblk(in_stack_000016c8,in_stack_000016c0,in_stack_000016bc,in_stack_000016b0);
      }
      if (0 < lVar2) {
        ffshft(in_stack_00018668,in_stack_00018660,in_stack_00018658,in_stack_00018650,
               in_stack_00018648);
      }
      *(long *)(*(long *)(in_RDI + 2) + 0x3d8) = lVar2 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
      ffmkyj(in_stack_00000098,(char *)in_stack_00000090,in_stack_00000088,in_stack_00000080,
             in_stack_00000078);
      ffmkyj(in_stack_00000098,(char *)in_stack_00000090,in_stack_00000088,in_stack_00000080,
             in_stack_00000078);
      *(long *)(*(long *)(in_RDI + 2) + 0x3c0) = in_RDX + *(long *)(*(long *)(in_RDI + 2) + 0x3c0);
      *(long *)(*(long *)(in_RDI + 2) + 0x3b8) = in_RDX + *(long *)(*(long *)(in_RDI + 2) + 0x3b8);
      iVar3 = *in_RCX;
    }
  }
  else {
    iVar3 = *in_RCX;
  }
  return iVar3;
}

Assistant:

int ffirow(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstrow,   /* I - insert space AFTER this row              */
                            /*     0 = insert space at beginning of table   */
           LONGLONG nrows,      /* I - number of rows to insert                 */
           int *status)     /* IO - error status                            */
/*
 insert NROWS blank rows immediated after row firstrow (1 = first row).
 Set firstrow = 0 to insert space at the beginning of the table.
*/
{
    int tstatus;
    LONGLONG naxis1, naxis2;
    LONGLONG datasize, firstbyte, nshift, nbytes;
    LONGLONG freespace;
    long nblock;

    if (*status > 0)
        return(*status);

        /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
         /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only add rows to TABLE or BINTABLE extension (ffirow)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    /* get the current size of the table */
    /* use internal structure since NAXIS2 keyword may not be up to date */
    naxis1 = (fptr->Fptr)->rowlength;
    naxis2 = (fptr->Fptr)->numrows;

    if (firstrow > naxis2)
    {
        ffpmsg(
   "Insert position greater than the number of rows in the table (ffirow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow < 0)
    {
        ffpmsg("Insert position is less than 0 (ffirow)");
        return(*status = BAD_ROW_NUM);
    }

    /* current data size */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nshift = naxis1 * nrows;          /* no. of bytes to add to table */

    if ( (freespace - nshift) < 0)   /* not enough existing space? */
    {
        nblock = (long) ((nshift - freespace + 2879) / 2880);   /* number of blocks */
        ffiblk(fptr, nblock, 1, status);               /* insert the blocks */
    }

    firstbyte = naxis1 * firstrow;    /* relative insert position */
    nbytes = datasize - firstbyte;           /* no. of bytes to shift down */
    firstbyte += ((fptr->Fptr)->datastart);  /* absolute insert position */

    if (nshift > 0) {  /* nshift may be zero if naxis1 == naxis2 == 0 */
      ffshft(fptr, firstbyte, nbytes, nshift, status); /* shift rows and heap */
    }

    /* update the heap starting address */
    (fptr->Fptr)->heapstart += nshift;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

    /* update the NAXIS2 keyword */
    ffmkyj(fptr, "NAXIS2", naxis2 + nrows, "&", status);
    ((fptr->Fptr)->numrows) += nrows;
    ((fptr->Fptr)->origrows) += nrows;

    return(*status);
}